

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
CopyAttributeIntoNode(UA_Server *server,UA_Session *session,UA_Node *node,UA_WriteValue *wvalue)

{
  UA_DataValue *value;
  UA_NodeId *dataType;
  size_t arrayDimensionsSize;
  UA_SecureChannel *pUVar1;
  undefined1 uVar2;
  UA_StatusCode UVar3;
  UA_DataType *pUVar4;
  long lVar5;
  ulong uVar6;
  anon_union_16_4_621dfe33_for_identifier *p;
  ulong uVar7;
  long lVar8;
  
  if (0x15 < wvalue->attributeId - 1) {
    UVar3 = 0x80350000;
    goto LAB_0011fc3a;
  }
  value = &wvalue->value;
  dataType = (UA_NodeId *)(wvalue->value).value.data;
  switch(wvalue->attributeId) {
  default:
    UVar3 = 0x80730000;
    break;
  case 3:
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13e740)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      p = (anon_union_16_4_621dfe33_for_identifier *)&node->browseName;
      pUVar4 = UA_TYPES + 0x13;
      deleteMembers_noInit(p,UA_TYPES + 0x13);
      *(undefined8 *)&node->browseName = 0;
      (node->browseName).name.length = 0;
      (node->browseName).name.data = (UA_Byte *)0x0;
LAB_0011f8fc:
      UA_copy(dataType,p,pUVar4);
      return 0;
    }
    break;
  case 4:
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13e770)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      p = (anon_union_16_4_621dfe33_for_identifier *)&node->displayName;
      pUVar4 = UA_TYPES + 0x14;
      deleteMembers_noInit(p,UA_TYPES + 0x14);
      (node->displayName).text.length = 0;
      (node->displayName).text.data = (UA_Byte *)0x0;
      (node->displayName).locale.length = 0;
      (node->displayName).locale.data = (UA_Byte *)0x0;
      goto LAB_0011f8fc;
    }
    break;
  case 5:
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13e770)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      p = (anon_union_16_4_621dfe33_for_identifier *)&node->description;
      pUVar4 = UA_TYPES + 0x14;
      deleteMembers_noInit(p,UA_TYPES + 0x14);
      (node->description).text.length = 0;
      (node->description).text.data = (UA_Byte *)0x0;
      (node->description).locale.length = 0;
      (node->description).locale.data = (UA_Byte *)0x0;
      goto LAB_0011f8fc;
    }
    break;
  case 6:
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13e4d0)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      node->writeMask = *(UA_UInt32 *)dataType;
      return 0;
    }
    break;
  case 7:
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13e4d0)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      node->userWriteMask = *(UA_UInt32 *)dataType;
      return 0;
    }
    break;
  case 8:
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
       (dataType < (UA_NodeId *)0x2 || (wvalue->value).value.arrayLength != 0)) break;
    UVar3 = writeIsAbstractAttribute(node,SUB21(dataType->namespaceIndex,0));
    goto LAB_0011f74c;
  case 9:
    uVar2 = (char)node->nodeClass & UA_NODECLASS_REFERENCETYPE;
    goto joined_r0x0011fa69;
  case 10:
    UVar3 = 0x805f0000;
    if ((((node->nodeClass & UA_NODECLASS_REFERENCETYPE) != UA_NODECLASS_UNSPECIFIED) &&
        (UVar3 = 0x80740000,
        (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0)) &&
       (((wvalue->value).value.type == (UA_DataType *)0x13e770 &&
        ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)))) {
      p = &node[1].nodeId.identifier;
      pUVar4 = UA_TYPES + 0x14;
      deleteMembers_noInit(p,UA_TYPES + 0x14);
      *(undefined8 *)&node[1].nodeClass = 0;
      *(undefined8 *)&node[1].browseName = 0;
      node[1].nodeId.identifier.string.length = 0;
      node[1].nodeId.identifier.string.data = (UA_Byte *)0x0;
      goto LAB_0011f8fc;
    }
    break;
  case 0xb:
    uVar2 = (char)node->nodeClass & UA_NODECLASS_VIEW;
    goto joined_r0x0011fa69;
  case 0xc:
    if ((node->nodeClass & (UA_NODECLASS_VIEW|UA_NODECLASS_OBJECT)) == UA_NODECLASS_UNSPECIFIED) {
LAB_0011fac9:
      UVar3 = 0x805f0000;
      break;
    }
    UVar3 = 0x80740000;
    if ((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
        (undefined1  [96])0x0) break;
    pUVar4 = (UA_DataType *)0x13e410;
    goto LAB_0011f9e0;
  case 0xd:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011fac9;
    UVar3 = writeValueAttribute(server,(UA_VariableNode *)node,value,&wvalue->indexRange);
    goto LAB_0011f74c;
  case 0xe:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011fac9;
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x13e6b0)) ||
       (dataType < (UA_NodeId *)0x2 || (wvalue->value).value.arrayLength != 0)) break;
    UVar3 = writeDataTypeAttributeWithVT(server,(UA_VariableNode *)node,dataType);
    goto LAB_0011f74c;
  case 0xf:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011fac9;
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x13e4a0)) ||
       (dataType < (UA_NodeId *)0x2 || (wvalue->value).value.arrayLength != 0)) break;
    UVar3 = writeValueRankAttributeWithVT(server,(UA_VariableNode *)node,*(UA_Int32 *)dataType);
    goto LAB_0011f74c;
  case 0x10:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011fac9;
    UVar3 = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x13e4d0)) ||
       (arrayDimensionsSize = (wvalue->value).value.arrayLength,
       arrayDimensionsSize == 0 && (UA_NodeId *)0x1 < dataType)) break;
    UVar3 = writeArrayDimensionsAttribute
                      (server,(UA_VariableNode *)node,arrayDimensionsSize,(UA_UInt32 *)dataType);
LAB_0011f74c:
    if (UVar3 == 0) {
      return 0;
    }
    break;
  case 0x11:
    UVar3 = 0x805f0000;
    if (((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
         (UVar3 = 0x80740000,
         (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
         (undefined1  [96])0x0)) && ((wvalue->value).value.type == (UA_DataType *)0x13e410)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      *(char *)&node[2].browseName.namespaceIndex = (char)dataType->namespaceIndex;
      return 0;
    }
    break;
  case 0x12:
    UVar3 = 0x805f0000;
    if ((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
        (UVar3 = 0x80740000,
        (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0)) &&
       (((wvalue->value).value.type == (UA_DataType *)0x13e410 &&
        ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)))) {
      *(char *)((long)&node[2].browseName.namespaceIndex + 1) = (char)dataType->namespaceIndex;
      return 0;
    }
    break;
  case 0x13:
    UVar3 = 0x805f0000;
    if ((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
        (UVar3 = 0x80740000,
        (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0)) &&
       (((wvalue->value).value.type == (UA_DataType *)0x13e590 &&
        ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)))) {
      node[2].browseName.name.length = *(size_t *)dataType;
      return 0;
    }
    break;
  case 0x14:
    UVar3 = 0x805f0000;
    if (((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
         (UVar3 = 0x80740000,
         (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
         (undefined1  [96])0x0)) && ((wvalue->value).value.type == UA_TYPES)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      *(char *)&node[2].browseName.name.data = (char)dataType->namespaceIndex;
      return 0;
    }
    break;
  case 0x15:
    UVar3 = 0x805f0000;
    if (((node->nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED) ||
       (UVar3 = 0x80740000,
       (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) == (undefined1  [96])0x0
       )) break;
    pUVar4 = UA_TYPES;
LAB_0011f9e0:
    UVar3 = 0x80740000;
    if (((wvalue->value).value.type == pUVar4) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      *(char *)&node[1].nodeId.namespaceIndex = (char)dataType->namespaceIndex;
      return 0;
    }
    break;
  case 0x16:
    uVar2 = (char)node->nodeClass & UA_NODECLASS_METHOD;
joined_r0x0011fa69:
    UVar3 = 0x805f0000;
    if ((((uVar2 != UA_NODECLASS_UNSPECIFIED) &&
         (UVar3 = 0x80740000,
         (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
         (undefined1  [96])0x0)) && ((wvalue->value).value.type == UA_TYPES)) &&
       ((UA_NodeId *)0x1 < dataType && (wvalue->value).value.arrayLength == 0)) {
      *(char *)((long)&node[1].nodeId.namespaceIndex + 1) = (char)dataType->namespaceIndex;
      return 0;
    }
  }
LAB_0011fc3a:
  pUVar1 = session->channel;
  if (pUVar1 == (UA_SecureChannel *)0x0) {
    uVar6 = 0;
    uVar7 = 0;
  }
  else {
    if (pUVar1->connection == (UA_Connection *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)(uint)pUVar1->connection->sockfd;
    }
    uVar7 = (ulong)(pUVar1->securityToken).channelId;
  }
  lVar5 = 0;
  lVar8 = 0x141ba0;
  do {
    if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar5) == UVar3) {
      lVar8 = (long)&statusCodeDescriptions[0].code + lVar5;
      break;
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x1578);
  UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | WriteRequest returned status code %s"
              ,uVar6,uVar7,(ulong)(session->sessionId).identifier.numeric,
              (ulong)(session->sessionId).identifier.guid.data2,
              (ulong)(session->sessionId).identifier.guid.data3,
              (ulong)(session->sessionId).identifier.guid.data4[0],
              (ulong)(session->sessionId).identifier.guid.data4[1],
              (ulong)(session->sessionId).identifier.guid.data4[2],
              (ulong)(session->sessionId).identifier.guid.data4[3],
              (ulong)(session->sessionId).identifier.guid.data4[4],
              (ulong)(session->sessionId).identifier.guid.data4[5],
              (ulong)(session->sessionId).identifier.guid.data4[6],
              (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar8 + 8));
  return UVar3;
}

Assistant:

static UA_StatusCode
CopyAttributeIntoNode(UA_Server *server, UA_Session *session,
                      UA_Node *node, const UA_WriteValue *wvalue) {
    const void *value = wvalue->value.value.data;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(wvalue->attributeId) {
    case UA_ATTRIBUTEID_NODEID:
    case UA_ATTRIBUTEID_NODECLASS:
        retval = UA_STATUSCODE_BADWRITENOTSUPPORTED;
        break;
    case UA_ATTRIBUTEID_BROWSENAME:
        CHECK_DATATYPE_SCALAR(QUALIFIEDNAME);
        UA_QualifiedName_deleteMembers(&node->browseName);
        UA_QualifiedName_copy(value, &node->browseName);
        break;
    case UA_ATTRIBUTEID_DISPLAYNAME:
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&node->displayName);
        UA_LocalizedText_copy(value, &node->displayName);
        break;
    case UA_ATTRIBUTEID_DESCRIPTION:
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&node->description);
        UA_LocalizedText_copy(value, &node->description);
        break;
    case UA_ATTRIBUTEID_WRITEMASK:
        CHECK_DATATYPE_SCALAR(UINT32);
        node->writeMask = *(const UA_UInt32*)value;
        break;
    case UA_ATTRIBUTEID_USERWRITEMASK:
        CHECK_DATATYPE_SCALAR(UINT32);
        node->userWriteMask = *(const UA_UInt32*)value;
        break;
    case UA_ATTRIBUTEID_ISABSTRACT:
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        retval = writeIsAbstractAttribute(node, *(const UA_Boolean*)value);
        break;
    case UA_ATTRIBUTEID_SYMMETRIC:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_REFERENCETYPE);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_ReferenceTypeNode*)node)->symmetric = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_INVERSENAME:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_REFERENCETYPE);
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&((UA_ReferenceTypeNode*)node)->inverseName);
        UA_LocalizedText_copy(value, &((UA_ReferenceTypeNode*)node)->inverseName);
        break;
    case UA_ATTRIBUTEID_CONTAINSNOLOOPS:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VIEW);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_ViewNode*)node)->containsNoLoops = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_EVENTNOTIFIER:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VIEW | UA_NODECLASS_OBJECT);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_ViewNode*)node)->eventNotifier = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_VALUE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = writeValueAttribute(server, (UA_VariableNode*)node,
                                     &wvalue->value, &wvalue->indexRange);
        break;
    case UA_ATTRIBUTEID_DATATYPE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_SCALAR(NODEID);
        retval = writeDataTypeAttributeWithVT(server, (UA_VariableNode*)node, (const UA_NodeId*)value);
        break;
    case UA_ATTRIBUTEID_VALUERANK:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_SCALAR(INT32);
        retval = writeValueRankAttributeWithVT(server, (UA_VariableNode*)node, *(const UA_Int32*)value);
        break;
    case UA_ATTRIBUTEID_ARRAYDIMENSIONS:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_ARRAY(UINT32);
        retval = writeArrayDimensionsAttribute(server, (UA_VariableNode*)node,
                                               wvalue->value.value.arrayLength,
                                               wvalue->value.value.data);
        break;
    case UA_ATTRIBUTEID_ACCESSLEVEL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_VariableNode*)node)->accessLevel = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_USERACCESSLEVEL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_VariableNode*)node)->userAccessLevel = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_MINIMUMSAMPLINGINTERVAL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(DOUBLE);
        ((UA_VariableNode*)node)->minimumSamplingInterval = *(const UA_Double*)value;
        break;
    case UA_ATTRIBUTEID_HISTORIZING:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_VariableNode*)node)->historizing = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_EXECUTABLE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_METHOD);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_MethodNode*)node)->executable = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_USEREXECUTABLE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_METHOD);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_MethodNode*)node)->userExecutable = *(const UA_Boolean*)value;
        break;
    default:
        retval = UA_STATUSCODE_BADATTRIBUTEIDINVALID;
        break;
    }
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "WriteRequest returned status code %s",
                            UA_StatusCode_name(retval));
    return retval;
}